

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

LineTable * __thiscall llvm::DWARFDebugLine::getLineTable(DWARFDebugLine *this,uint64_t Offset)

{
  const_iterator cVar1;
  LineTable *pLVar2;
  uint64_t local_18;
  uint64_t Offset_local;
  
  local_18 = Offset;
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
          ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>,_std::_Select1st<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>_>
                  *)this,&local_18);
  pLVar2 = (LineTable *)0x0;
  if ((_Rb_tree_header *)cVar1._M_node != &(this->LineTableMap)._M_t._M_impl.super__Rb_tree_header)
  {
    pLVar2 = (LineTable *)&cVar1._M_node[1]._M_parent;
  }
  return pLVar2;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFDebugLine::getLineTable(uint64_t Offset) const {
  LineTableConstIter Pos = LineTableMap.find(Offset);
  if (Pos != LineTableMap.end())
    return &Pos->second;
  return nullptr;
}